

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O3

void __thiscall
UDPSplitPacketReader::UDPSplitPacketReader
          (UDPSplitPacketReader *this,void **vtt,Socket *socket,int max,int mtu)

{
  sockfd_t sVar1;
  void *pvVar2;
  
  sVar1 = socket->sockfd;
  pvVar2 = *vtt;
  *(void **)this = pvVar2;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar2 + -0x30)) = vtt[1];
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x20)) = vtt[2];
  (this->receivedPackets).
  super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->receivedPackets;
  (this->receivedPackets).
  super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->receivedPackets;
  (this->receivedPackets).
  super__List_base<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
  ._M_impl._M_node._M_size = 0;
  (this->currentPacket)._M_node = (_List_node_base *)0x0;
  this->socket = sVar1;
  this->max = max;
  this->mtu = mtu;
  this->receivedPacket = false;
  return;
}

Assistant:

UDPSplitPacketReader::UDPSplitPacketReader(Socket::sockfd_t socket, int max, int mtu) {
  this->socket = socket;
  this->max = max;
  this->mtu = mtu;
  receivedPacket = false;
}